

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_query.cpp
# Opt level: O0

unique_ptr<cmake,_std::default_delete<cmake>_> __thiscall
cmakels::cmake_query::instantiate_cmake(cmake_query *this,path *root_dir)

{
  bool bVar1;
  char *argv0;
  runtime_error *this_00;
  pointer this_01;
  string local_a0;
  string local_80;
  undefined1 local_50 [8];
  path cmake_exe_in_build_tree;
  Mode local_20;
  byte local_19;
  path *local_18;
  path *root_dir_local;
  __single_object *my_cmake;
  
  local_19 = 0;
  local_20 = Script;
  cmake_exe_in_build_tree._36_4_ = 1;
  local_18 = root_dir;
  root_dir_local = &this->root_dir_;
  std::make_unique<cmake,cmake::Role,cmState::Mode>((Role *)this,&local_20);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             config::cmake_exe_path_abi_cxx11_,auto_format);
  bVar1 = std::filesystem::exists((path *)local_50);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Couldn\'t find CMake resources.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::filesystem::__cxx11::path::string(&local_80,(path *)local_50);
  argv0 = (char *)std::__cxx11::string::c_str();
  cmSystemTools::FindCMakeResources(argv0);
  std::__cxx11::string::~string((string *)&local_80);
  this_01 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->
                      ((unique_ptr<cmake,_std::default_delete<cmake>_> *)this);
  std::filesystem::__cxx11::path::string(&local_a0,root_dir);
  cmake::SetHomeDirectory(this_01,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  local_19 = 1;
  std::filesystem::__cxx11::path::~path((path *)local_50);
  if ((local_19 & 1) == 0) {
    std::unique_ptr<cmake,_std::default_delete<cmake>_>::~unique_ptr
              ((unique_ptr<cmake,_std::default_delete<cmake>_> *)this);
  }
  return (__uniq_ptr_data<cmake,_std::default_delete<cmake>,_true,_true>)
         (__uniq_ptr_data<cmake,_std::default_delete<cmake>,_true,_true>)this;
}

Assistant:

std::unique_ptr<cmake> instantiate_cmake(fs::path root_dir) {
  auto my_cmake = std::make_unique<cmake>(cmake::RoleProject, cmState::Project);

  // TODO the following is a hack for the weird global state that CMake needs
  // to initialize, probably we should avoid using FindCMakeResources and try
  // to initialize the relevant parts by hand
  fs::path cmake_exe_in_build_tree = config::cmake_exe_path;
  // TODO fix for install
  // fs::path cmake_exe_in_install_tree =
  //     cmakels_dir.parent_path().parent_path() / "bin/cmake.exe";

  // string().c_str() to convert path to const char* on win, see
  // https://stackoverflow.com/a/54109263/5085250
  if (fs::exists(cmake_exe_in_build_tree))
    cmSystemTools::FindCMakeResources(cmake_exe_in_build_tree.string().c_str());
  // else if (fs::exists(cmake_exe_in_install_tree))
  //   cmSystemTools::FindCMakeResources(cmake_exe_in_install_tree.string().c_str());
  else
    throw std::runtime_error("Couldn't find CMake resources.");

  my_cmake->SetHomeDirectory(root_dir.string());
  return my_cmake;
}